

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O1

int __thiscall
gmlc::utilities::string_viewOps::trailingStringInt
          (string_viewOps *this,string_view input,string_view *output,int defNum)

{
  string_viewOps sVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  long lVar5;
  string_viewOps *psVar6;
  int iVar7;
  size_t sVar8;
  string_viewOps *psVar9;
  string_viewOps *psVar10;
  bool bVar11;
  
  iVar7 = (int)output;
  pcVar4 = input._M_str;
  sVar8 = input._M_len;
  if ((this != (string_viewOps *)0x0) &&
     (sVar1 = this[sVar8 - 1], 0xf5 < (byte)((char)sVar1 - 0x3aU))) {
    psVar9 = this + -1;
    do {
      pvVar3 = memchr("0123456789",(int)(char)psVar9[sVar8],10);
      if (pvVar3 == (void *)0x0) goto LAB_003df4ef;
      bVar11 = psVar9 != (string_viewOps *)0x0;
      psVar9 = psVar9 + -1;
    } while (bVar11);
    psVar9 = (string_viewOps *)0xffffffffffffffff;
LAB_003df4ef:
    if (psVar9 == (string_viewOps *)0xffffffffffffffff) {
      if (this < (string_viewOps *)0xb) {
        pcVar4[0] = '\0';
        pcVar4[1] = '\0';
        pcVar4[2] = '\0';
        pcVar4[3] = '\0';
        pcVar4[4] = '\0';
        pcVar4[5] = '\0';
        pcVar4[6] = '\0';
        pcVar4[7] = '\0';
        pcVar4[8] = '\0';
        pcVar4[9] = '\0';
        pcVar4[10] = '\0';
        pcVar4[0xb] = '\0';
        pcVar4[0xc] = '\0';
        pcVar4[0xd] = '\0';
        pcVar4[0xe] = '\0';
        pcVar4[0xf] = '\0';
        psVar9 = (string_viewOps *)0x0;
        iVar7 = 0;
        do {
          iVar2 = ((byte)psVar9[sVar8] - 0x30) + iVar7 * 10;
          if (9 < (byte)((char)psVar9[sVar8] - 0x30U)) {
            iVar2 = iVar7;
          }
          iVar7 = iVar2;
          psVar9 = psVar9 + 1;
        } while (this != psVar9);
        return iVar7;
      }
      psVar9 = this + -10;
    }
    if (psVar9 == this + -2) {
      iVar7 = (byte)sVar1 - 0x30;
      psVar10 = psVar9;
    }
    else if ((this < (string_viewOps *)0xb) || (psVar10 = this + -10, psVar10 <= psVar9)) {
      psVar6 = psVar9 + 1;
      if (this < psVar6) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   psVar6,this);
      }
      iVar7 = 0;
      psVar10 = psVar9;
      if (psVar6 != this) {
        iVar7 = 0;
        do {
          iVar2 = ((byte)psVar6[sVar8] - 0x30) + iVar7 * 10;
          if (9 < (byte)((char)psVar6[sVar8] - 0x30U)) {
            iVar2 = iVar7;
          }
          iVar7 = iVar2;
          psVar6 = psVar6 + 1;
        } while (this != psVar6);
      }
    }
    else {
      iVar7 = 0;
      lVar5 = -9;
      do {
        iVar2 = ((byte)this[lVar5 + sVar8] - 0x30) + iVar7 * 10;
        if (9 < (byte)((char)this[lVar5 + sVar8] - 0x30U)) {
          iVar2 = iVar7;
        }
        iVar7 = iVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0);
    }
    if ((psVar10[sVar8] != (string_viewOps)0x5f) && (psVar10[sVar8] != (string_viewOps)0x23)) {
      psVar10 = psVar10 + 1;
    }
    if (psVar10 <= this) {
      this = psVar10;
    }
  }
  *(string_viewOps **)pcVar4 = this;
  *(size_t *)(pcVar4 + 8) = sVar8;
  return iVar7;
}

Assistant:

int trailingStringInt(
    std::string_view input,
    std::string_view& output,
    int defNum)
{
    if (input.empty() || (input.back() < '0' || input.back() > '9')) {
        output = input;
        return defNum;
    }
    int num = defNum;
    auto pos1 = input.find_last_not_of(digits);
    if (pos1 == std::string_view::npos)  // in case the whole thing is a number
    {
        if (input.length() <= 10) {
            output = std::string_view{};
            num = toIntSimple(input);
            return num;
        }
        pos1 = input.length() - 10;
    }
    size_t length = input.length();
    if (pos1 == length - 2) {
        num = input.back() - '0';
    } else if (length <= 10 || pos1 >= length - 10) {
        num = toIntSimple(input.substr(pos1 + 1));
    } else {
        num = toIntSimple(input.substr(length - 9));
        pos1 = length - 10;
    }

    if (input[pos1] == '_' || input[pos1] == '#') {
        output = input.substr(0, pos1);
    } else {
        output = input.substr(0, pos1 + 1);
    }

    return num;
}